

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildtexture.cpp
# Opt level: O2

void __thiscall FTextureManager::AddTiles(FTextureManager *this,void *tiles)

{
  long lVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  FTextureID picnum;
  long lVar7;
  FBuildTexture *this_00;
  long lVar8;
  FTextureID FVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  byte *pixels;
  undefined8 local_88;
  spriteframe_t rot;
  
  iVar4 = *(int *)((long)tiles + 8);
  iVar5 = *(int *)((long)tiles + 0xc);
  lVar7 = (long)((iVar5 - iVar4) + 1);
  local_88 = (long)tiles + lVar7 * 2 + 0x10;
  lVar1 = local_88 + lVar7 * 2;
  pixels = (byte *)(lVar1 + lVar7 * 4);
  lVar7 = (long)iVar4;
  do {
    if (iVar5 < lVar7) {
      return;
    }
    lVar10 = lVar7 - iVar4;
    uVar2 = *(ushort *)((long)tiles + lVar10 * 2 + 0x10);
    if ((uVar2 != 0) && (uVar3 = *(ushort *)(local_88 + lVar10 * 2), uVar3 != 0)) {
      uVar12 = *(uint *)(lVar1 + lVar10 * 4);
      this_00 = (FBuildTexture *)operator_new(0x68);
      FBuildTexture::FBuildTexture
                (this_00,(int)lVar7,pixels,(uint)uVar2,(uint)uVar3,
                 (uint)(uVar2 >> 1) + (int)(char)(uVar12 >> 8),
                 (uint)(uVar3 >> 1) + (int)(char)(uVar12 >> 0x10));
      picnum = AddTexture(this,(FTexture *)this_00);
      for (iVar11 = (uint)uVar3 * (uint)uVar2; 0 < iVar11; iVar11 = iVar11 + -1) {
        *pixels = ~*pixels;
        pixels = pixels + 1;
      }
      (*StartScreen->_vptr_FStartupScreen[2])();
      uVar6 = *(uint *)(lVar1 + lVar10 * 4);
      if (((uVar6 & 0x3f) != 0) && ((uVar6 & 0xc0) != 0)) {
        AddSimpleAnim(this,picnum,uVar6 & 0x3f,
                      *(DWORD *)(&DAT_005eb2e4 + (ulong)((uVar6 & 0xc0) >> 6) * 4),
                      (uint)(1000 << ((byte)(uVar12 >> 0x18) & 0xf)) / 0x78);
      }
      uVar12 = uVar12 >> 0x1c & 7;
      if (uVar12 == 1) {
        lVar10 = 0x44;
        rot.Texture[0] = picnum;
        rot.Texture[1] = picnum;
        for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
          iVar11 = picnum.texnum + 1 + (int)lVar8;
          *(int *)((long)&((spriteframe_t *)(rot.Texture + -2))->Voxel + lVar10) = iVar11;
          *(int *)((long)(rot.Texture + -3) + lVar10) = iVar11;
          rot.Texture[lVar8 * 2 + 3].texnum = iVar11;
          rot.Texture[lVar8 * 2 + 2].texnum = iVar11;
          lVar10 = lVar10 + -8;
        }
        rot.Texture[8].texnum = picnum.texnum + 4;
        rot.Flip = 0xfc;
        rot.Texture[9].texnum = rot.Texture[8].texnum;
      }
      else {
        if (uVar12 != 2) goto LAB_004e38bf;
        FVar9 = picnum;
        for (lVar10 = 8; FVar9.texnum = FVar9.texnum + 1, lVar10 != 1; lVar10 = lVar10 + -1) {
          rot.Texture[lVar10 * 2 + -1].texnum = FVar9.texnum;
          rot.Texture[lVar10 * 2 + -2].texnum = FVar9.texnum;
        }
        rot.Flip = 0;
        rot.Texture[0] = picnum;
        rot.Texture[1] = picnum;
      }
      rot.Voxel = (FVoxelDef *)0x0;
      uVar12 = TArray<spriteframe_t,_spriteframe_t>::Push(&SpriteFrames,&rot);
      (this_00->super_FTexture).Rotations = (WORD)uVar12;
    }
LAB_004e38bf:
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

void FTextureManager::AddTiles (void *tiles)
{
//	int numtiles = LittleLong(((DWORD *)tiles)[1]);	// This value is not reliable
	int tilestart = LittleLong(((DWORD *)tiles)[2]);
	int tileend = LittleLong(((DWORD *)tiles)[3]);
	const WORD *tilesizx = &((const WORD *)tiles)[8];
	const WORD *tilesizy = &tilesizx[tileend - tilestart + 1];
	const DWORD *picanm = (const DWORD *)&tilesizy[tileend - tilestart + 1];
	BYTE *tiledata = (BYTE *)&picanm[tileend - tilestart + 1];

	for (int i = tilestart; i <= tileend; ++i)
	{
		int pic = i - tilestart;
		int width = LittleShort(tilesizx[pic]);
		int height = LittleShort(tilesizy[pic]);
		DWORD anm = LittleLong(picanm[pic]);
		int xoffs = (SBYTE)((anm >> 8) & 255) + width/2;
		int yoffs = (SBYTE)((anm >> 16) & 255) + height/2;
		int size = width*height;
		FTextureID texnum;
		FTexture *tex;

		if (width <= 0 || height <= 0) continue;

		tex = new FBuildTexture (i, tiledata, width, height, xoffs, yoffs);
		texnum = AddTexture (tex);
		while (size > 0)
		{
			*tiledata = 255 - *tiledata;
			tiledata++;
			size--;
		}
		StartScreen->Progress();

		if ((picanm[pic] & 63) && (picanm[pic] & 192))
		{
			int type, speed;

			switch (picanm[pic] & 192)
			{
			case 64:	type = 2;	break;
			case 128:	type = 0;	break;
			case 192:	type = 1;	break;
			default:    type = 0;   break;  // Won't happen, but GCC bugs me if I don't put this here.
			}

			speed = (anm >> 24) & 15;
			speed = MAX (1, (1 << speed) * 1000 / 120);	// Convert from 120 Hz to 1000 Hz.

			AddSimpleAnim (texnum, picanm[pic] & 63, type, speed);
		}

		// Blood's rotation types:
		// 0 - Single
		// 1 - 5 Full
		// 2 - 8 Full
		// 3 - Bounce (looks no different from Single; seems to signal bouncy sprites)
		// 4 - 5 Half (not used in game)
		// 5 - 3 Flat (not used in game)
		// 6 - Voxel
		// 7 - Spin Voxel

		int rotType = (anm >> 28) & 7;
		if (rotType == 1)
		{
			spriteframe_t rot;
			rot.Texture[0] =
			rot.Texture[1] = texnum;
			for (int j = 1; j < 4; ++j)
			{
				rot.Texture[j*2] =
				rot.Texture[j*2+1] =
				rot.Texture[16-j*2] =
				rot.Texture[17-j*2] = texnum.GetIndex() + j;
			}
			rot.Texture[8] =
			rot.Texture[9] = texnum.GetIndex() + 4;
			rot.Flip = 0x00FC;
			rot.Voxel = NULL;
			tex->Rotations = SpriteFrames.Push (rot);
		}
		else if (rotType == 2)
		{
			spriteframe_t rot;
			rot.Texture[0] =
			rot.Texture[1] = texnum;
			for (int j = 1; j < 8; ++j)
			{
				rot.Texture[16-j*2] =
				rot.Texture[17-j*2] = texnum.GetIndex() + j;
			}
			rot.Flip = 0;
			rot.Voxel = NULL;
			tex->Rotations = SpriteFrames.Push (rot);
		}
	}
}